

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::Sticker::~Sticker(Sticker *this)

{
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            (&(this->sort_value).super_field<int>.t_);
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
            (&(this->user).super_field<discordpp::User>.t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->guild_id).super_field<discordpp::Snowflake>.t_);
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr
            (&(this->available).super_field<bool>.t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->format_type).t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->type).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->asset).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->tags).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->description).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->name).t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->pack_id).super_field<discordpp::Snowflake>.t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            ((unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> *)this);
  return;
}

Assistant:

Sticker(
        field<Snowflake> id = uninitialized,
        omittable_field<Snowflake> pack_id = omitted,
        field<std::string> name = uninitialized,
        nullable_field<std::string> description = uninitialized,
        field<std::string> tags = uninitialized,
        omittable_field<std::string> asset = omitted,
        field<int> type = uninitialized,
        field<int> format_type = uninitialized,
        omittable_field<bool> available = omitted,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<User> user = omitted,
        omittable_field<int> sort_value = omitted
    ):
        id(id),
        pack_id(pack_id),
        name(name),
        description(description),
        tags(tags),
        asset(asset),
        type(type),
        format_type(format_type),
        available(available),
        guild_id(guild_id),
        user(user),
        sort_value(sort_value)
    {}